

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_int64 StreamReadLine(io_private *pDev,char **pzData,jx9_int64 nMaxLen)

{
  jx9_io_stream *pjVar1;
  sxi32 sVar2;
  jx9_int64 local_2068;
  io_private *piStack_2040;
  sxi32 rc;
  jx9_int64 n;
  char zBuf [8192];
  jx9_io_stream *pStream;
  jx9_int64 nMaxLen_local;
  char **pzData_local;
  io_private *pDev_local;
  
  pjVar1 = pDev->pStream;
  piStack_2040 = (io_private *)0x0;
  if ((pDev->sBuffer).nByte <= pDev->nOfft) {
    SyBlobReset(&pDev->sBuffer);
    pDev->nOfft = 0;
  }
  if (((pDev->sBuffer).nByte == pDev->nOfft) ||
     (sVar2 = GetLine(pDev,(jx9_int64 *)&stack0xffffffffffffdfc0,pzData), sVar2 != 0)) {
    do {
      if ((nMaxLen < 1) || (local_2068 = nMaxLen, 0x1fff < (ulong)nMaxLen)) {
        local_2068 = 0x2000;
      }
      piStack_2040 = (io_private *)(*pjVar1->xRead)(pDev->pHandle,&n,local_2068);
      if ((long)piStack_2040 < 1) {
        if ((pDev->sBuffer).nByte != pDev->nOfft) {
          *pzData = (char *)((long)(pDev->sBuffer).pBlob + (ulong)pDev->nOfft);
          piStack_2040 = (io_private *)(ulong)((pDev->sBuffer).nByte - pDev->nOfft);
          SyBlobReset(&pDev->sBuffer);
          pDev->nOfft = 0;
        }
        return (jx9_int64)piStack_2040;
      }
      SyBlobAppend(&pDev->sBuffer,&n,(sxu32)piStack_2040);
      sVar2 = GetLine(pDev,(jx9_int64 *)&stack0xffffffffffffdfc0,pzData);
      if (sVar2 == 0) {
        pDev->nOfft = (int)piStack_2040 + pDev->nOfft;
        return (jx9_int64)piStack_2040;
      }
    } while ((nMaxLen < 1) || ((long)(ulong)((pDev->sBuffer).nByte - pDev->nOfft) < nMaxLen));
    *pzData = (char *)((long)(pDev->sBuffer).pBlob + (ulong)pDev->nOfft);
    piStack_2040 = (io_private *)(ulong)((pDev->sBuffer).nByte - pDev->nOfft);
    SyBlobReset(&pDev->sBuffer);
    pDev->nOfft = 0;
    pDev_local = piStack_2040;
  }
  else {
    pDev->nOfft = (int)piStack_2040 + pDev->nOfft;
    pDev_local = piStack_2040;
  }
  return (jx9_int64)pDev_local;
}

Assistant:

static jx9_int64 StreamReadLine(io_private *pDev, const char **pzData, jx9_int64 nMaxLen)
{
	const jx9_io_stream *pStream = pDev->pStream;
	char zBuf[8192];
	jx9_int64 n;
	sxi32 rc;
	n = 0;
	if( pDev->nOfft >= SyBlobLength(&pDev->sBuffer) ){
		/* Reset the working buffer so that we avoid excessive memory allocation */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Check if there is a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got line, update the cursor  */
			pDev->nOfft += (sxu32)n;
			return n;
		}
	}
	/* Perform the read operation until a new line is extracted or length
	 * limit is reached.
	 */
	for(;;){
		n = pStream->xRead(pDev->pHandle, zBuf, (nMaxLen > 0 && nMaxLen < sizeof(zBuf)) ? nMaxLen : sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Append the data just read */
		SyBlobAppend(&pDev->sBuffer, zBuf, (sxu32)n);
		/* Try to extract a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got one, return immediately */
			pDev->nOfft += (sxu32)n;
			return n;
		}
		if( nMaxLen > 0 && (SyBlobLength(&pDev->sBuffer) - pDev->nOfft >= nMaxLen) ){
			/* Read limit reached, return the available data */
			*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
			n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
			/* Reset the working buffer */
			SyBlobReset(&pDev->sBuffer);
			pDev->nOfft = 0;
			return n;
		}
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Read limit reached, return the available data */
		*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
		n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
		/* Reset the working buffer */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	return n;
}